

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

void __thiscall AActor::AdjustFloorClip(AActor *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  sector_t *psVar5;
  player_t *ppVar6;
  double dVar7;
  sector_t_conflict *psVar8;
  int iVar9;
  msecnode_t *pmVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_58;
  
  if (((this->flags3).Value & 0x20) == 0) {
    dVar12 = this->Floorclip;
    psVar5 = this->Sector;
    if (((psVar5->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) &&
       (((psVar5->floorplane).normal.Y * (this->__Pos).Y +
        (psVar5->floorplane).normal.X * (this->__Pos).X + (psVar5->floorplane).D) *
        (psVar5->floorplane).negiC < (this->__Pos).Z)) {
      this->Floorclip = 0.0;
    }
    pmVar10 = this->touching_sectorlist;
    if (pmVar10 == (msecnode_t *)0x0) {
      local_58 = 2147483647.0;
    }
    else {
      local_58 = 2147483647.0;
      do {
        iVar9 = this->Sector->PortalGroup;
        iVar4 = pmVar10->m_sector->PortalGroup;
        dVar11 = 0.0;
        dVar13 = 0.0;
        if (iVar9 != iVar4) {
          iVar9 = iVar4 * Displacements.size + iVar9;
          dVar11 = Displacements.data.Array[iVar9].pos.X;
          dVar13 = Displacements.data.Array[iVar9].pos.Y;
        }
        dVar2 = (this->__Pos).X;
        dVar3 = (this->__Pos).Y;
        psVar8 = sector_t::GetHeightSec((sector_t *)pmVar10->m_sector);
        dVar7 = local_58;
        if (psVar8 == (sector_t_conflict *)0x0) {
          psVar8 = pmVar10->m_sector;
          dVar11 = ((dVar3 + dVar13) * (psVar8->floorplane).normal.Y +
                   (dVar2 + dVar11) * (psVar8->floorplane).normal.X + (psVar8->floorplane).D) *
                   (psVar8->floorplane).negiC;
          pdVar1 = &(this->__Pos).Z;
          if ((dVar11 == *pdVar1) && (!NAN(dVar11) && !NAN(*pdVar1))) {
            iVar9 = sector_t::GetTerrain(psVar8,0);
            dVar7 = Terrains.Array[iVar9].FootClip;
            if (local_58 <= Terrains.Array[iVar9].FootClip) {
              dVar7 = local_58;
            }
          }
        }
        local_58 = dVar7;
        pmVar10 = pmVar10->m_tnext;
      } while (pmVar10 != (msecnode_t *)0x0);
    }
    local_58 = (double)(~-(ulong)(local_58 == 2147483647.0) & (ulong)local_58);
    this->Floorclip = local_58;
    ppVar6 = this->player;
    if ((ppVar6 != (player_t *)0x0) && (ppVar6->mo == (APlayerPawn *)this)) {
      if ((dVar12 != local_58) || (NAN(dVar12) || NAN(local_58))) {
        dVar12 = ppVar6->viewheight - (dVar12 - local_58);
        ppVar6->viewheight = dVar12;
        ppVar6->deltaviewheight =
             ((ppVar6->mo->ViewHeight + ppVar6->crouchviewdelta) - dVar12) * 0.125;
      }
    }
  }
  return;
}

Assistant:

void AActor::AdjustFloorClip ()
{
	if (flags3 & MF3_SPECIALFLOORCLIP)
	{
		return;
	}

	double oldclip = Floorclip;
	double shallowestclip = INT_MAX;
	const msecnode_t *m;

	// possibly standing on a 3D-floor
	if (Sector->e->XFloor.ffloors.Size() && Z() > Sector->floorplane.ZatPoint(this)) Floorclip = 0;

	// [RH] clip based on shallowest floor player is standing on
	// If the sector has a deep water effect, then let that effect
	// do the floorclipping instead of the terrain type.
	for (m = touching_sectorlist; m; m = m->m_tnext)
	{
		DVector3 pos = PosRelative(m->m_sector);
		sector_t *hsec = m->m_sector->GetHeightSec();
		if (hsec == NULL && m->m_sector->floorplane.ZatPoint (pos) == Z())
		{
			double clip = Terrains[m->m_sector->GetTerrain(sector_t::floor)].FootClip;
			if (clip < shallowestclip)
			{
				shallowestclip = clip;
			}
		}
	}
	if (shallowestclip == INT_MAX)
	{
		Floorclip = 0;
	}
	else
	{
		Floorclip = shallowestclip;
	}
	if (player && player->mo == this && oldclip != Floorclip)
	{
		player->viewheight -= (oldclip - Floorclip);
		player->deltaviewheight = player->GetDeltaViewHeight();
	}
}